

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# breadcrumb.c
# Opt level: O0

CgreenBreadcrumb * create_breadcrumb(void)

{
  CgreenBreadcrumb *breadcrumb;
  CgreenBreadcrumb *local_8;
  
  local_8 = (CgreenBreadcrumb *)malloc(0x10);
  if (local_8 == (CgreenBreadcrumb *)0x0) {
    local_8 = (CgreenBreadcrumb *)0x0;
  }
  else {
    local_8->trail = (char **)0x0;
    local_8->depth = 0;
    local_8->space = 0;
  }
  return local_8;
}

Assistant:

CgreenBreadcrumb *create_breadcrumb(void) {
    CgreenBreadcrumb *breadcrumb = (CgreenBreadcrumb *) malloc(sizeof(CgreenBreadcrumb));
    if (breadcrumb == NULL) {
        return NULL;
    }
    breadcrumb->trail = NULL;
    breadcrumb->depth = 0;
    breadcrumb->space = 0;
    return breadcrumb;
}